

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx::create_pipeline_int8_x86(Convolution_x86_avx *this,Option *opt)

{
  uint _c;
  _func_int **pp_Var1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  int _h;
  ulong uVar7;
  _func_int *p_Var8;
  int j;
  int iVar9;
  ulong uVar10;
  uint _w;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int i;
  ulong uVar17;
  Mat local_78;
  
  p_Var8 = this->_vptr_Convolution_x86_avx[-3];
  _c = *(uint *)(p_Var8 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
  _w = *(int *)(p_Var8 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) *
       *(int *)(p_Var8 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar5 = (long)((ulong)(uint)((int)((long)*(int *)(p_Var8 + 0x14 +
                                                   (long)&(this->weight_data_int8).data) /
                                    (long)(int)_w) >> 0x1f) << 0x20 |
                (long)*(int *)(p_Var8 + 0x14 + (long)&(this->weight_data_int8).data) / (long)(int)_w
                & 0xffffffffU) / (long)(int)_c;
  _h = (int)uVar5;
  uVar12 = 1;
  uVar16 = 1;
  if (opt->use_packing_layout == true) {
    uVar12 = 1;
    if ((uVar5 & 7) == 0) {
      uVar12 = 8;
    }
    uVar16 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
  }
  iVar11 = (int)uVar12;
  iVar15 = (int)uVar16;
  if ((iVar11 == 1) && (iVar15 == 1)) {
    if ((((*(int *)(p_Var8 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3) &&
         (*(int *)(p_Var8 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
        ((opt->use_winograd_convolution != false &&
         ((((*(int *)(p_Var8 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var8 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)(p_Var8 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
          ((0xf < (int)_c && (*(int *)((long)&this->convolution_dilation1 + (long)p_Var8) == 1))))))
        )) && (0xf < _h)) {
      conv3x3s1_winograd23_transform_kernel_int8_sse
                ((Mat *)(p_Var8 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),
                 &this->weight_data_3x3_winograd23_int8,_h,_c,(Option *)(ulong)_c);
    }
  }
  else {
    Mat::reshape(&local_78,
                 (Mat *)(p_Var8 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),_w,_h,
                 _c,(Allocator *)0x0);
    Mat::create(&this->weight_data_int8,_w,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)iVar11)
                ,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x30 +
                         (long)&(this->weight_data_3x3_winograd63).data) / iVar15,
                (ulong)(uint)(iVar15 * iVar11),iVar15 * iVar11,(Allocator *)0x0);
    pp_Var1 = this->_vptr_Convolution_x86_avx;
    p_Var8 = pp_Var1[-3];
    if (iVar15 <= *(int *)(p_Var8 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
      uVar5 = 0;
      do {
        if (iVar11 <= _h) {
          sVar2 = (this->weight_data_int8).cstep;
          sVar3 = (this->weight_data_int8).elemsize;
          pvVar4 = (this->weight_data_int8).data;
          iVar9 = (this->weight_data_int8).w;
          uVar7 = 0;
          do {
            if (0 < (int)_w) {
              lVar13 = (long)pvVar4 +
                       ((uVar7 & 0xffffffff) / uVar12) * (long)iVar9 * sVar3 +
                       ((uVar5 & 0xffffffff) / uVar16) * sVar2 * sVar3;
              uVar6 = 0;
              do {
                uVar10 = 0;
                do {
                  lVar14 = lVar13;
                  uVar17 = 0;
                  do {
                    *(undefined1 *)(lVar14 + uVar17) =
                         *(undefined1 *)
                          ((long)local_78.data +
                          uVar6 + (uVar7 + uVar17) * (long)local_78.w * local_78.elemsize +
                                  local_78.cstep * (uVar10 + uVar5) * local_78.elemsize);
                    uVar17 = uVar17 + 1;
                  } while (uVar12 != uVar17);
                  uVar10 = uVar10 + 1;
                  lVar13 = lVar14 + uVar17;
                } while (uVar10 != uVar16);
                uVar6 = uVar6 + 1;
                lVar13 = lVar14 + uVar17;
              } while (uVar6 != _w);
            }
            uVar7 = uVar7 + uVar12;
          } while ((long)uVar7 < (long)((long)_h - (ulong)(iVar11 - 1)));
          p_Var8 = pp_Var1[-3];
        }
        uVar5 = uVar5 + uVar16;
      } while ((long)(uVar5 + (iVar15 - 1)) <
               (long)*(int *)(p_Var8 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((iVar11 == 8) && (iVar15 == 4)) {
      p_Var8 = this->_vptr_Convolution_x86_avx[-3];
      iVar11 = *(int *)(p_Var8 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if (((iVar11 == 1) &&
          (*(int *)(p_Var8 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
         (((((*(int *)(p_Var8 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var8 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var8 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var8) == 1)) ||
          (((*(int *)(p_Var8 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var8 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var8 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 2 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var8) == 2)))))))) {
        iVar15 = *(int *)(p_Var8 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar11 = 1;
        iVar9 = 1;
      }
      else {
        if (opt->use_sgemm_convolution != true) {
          return 0;
        }
        iVar15 = *(int *)(p_Var8 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar9 = *(int *)(p_Var8 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var8 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),
                 &this->weight_data_int8,_h,iVar15,iVar11,iVar9);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
            //         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
        }
        else
        {
            // TODO offline transform weight
        }

        return 0;
    }

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_int8.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_int8.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                signed char* g00 = g0.row<signed char>(p / elempack);

                for (int k = 0; k < maxk; k++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + j).row<const signed char>(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
    }
#endif // __SSE2__

    return 0;
}